

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O0

bool __thiscall QTextDocumentPrivate::ensureMaximumBlockCount(QTextDocumentPrivate *this)

{
  int iVar1;
  int iVar2;
  QTextDocumentPrivate *in_RDI;
  long in_FS_OFFSET;
  QTextDocumentPrivate *unaff_retaddr;
  int blocksToRemove;
  QTextCursor cursor;
  QTextCharFormat charFmt;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  QTextDocumentPrivate *this_00;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  byte bVar3;
  undefined8 in_stack_fffffffffffffff0;
  long lVar4;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffffff0 >> 0x20);
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI->maximumBlockCount < 1) {
    bVar3 = 0;
  }
  else {
    this_00 = in_RDI;
    iVar1 = QFragmentMap<QTextBlockData>::numNodes(&in_RDI->blocks);
    if (in_RDI->maximumBlockCount < iVar1) {
      beginEditBlock(in_RDI);
      iVar1 = QFragmentMap<QTextBlockData>::numNodes(&in_RDI->blocks);
      iVar1 = iVar1 - in_RDI->maximumBlockCount;
      QTextCursor::QTextCursor
                ((QTextCursor *)&DAT_aaaaaaaaaaaaaaaa,
                 (QTextDocumentPrivate *)
                 CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
                 (int)((ulong)this_00 >> 0x20));
      QTextCursor::movePosition
                ((QTextCursor *)unaff_retaddr,(MoveOperation)((ulong)lVar4 >> 0x20),(MoveMode)lVar4,
                 iVar2);
      iVar2 = QTextCursor::selectionEnd((QTextCursor *)CONCAT44(iVar1,in_stack_ffffffffffffffc8));
      iVar1 = QTextCursor::selectionStart((QTextCursor *)CONCAT44(iVar1,in_stack_ffffffffffffffc8));
      in_RDI->unreachableCharacterCount = (iVar2 - iVar1) + in_RDI->unreachableCharacterCount;
      QTextCursor::blockCharFormat((QTextCursor *)this_00);
      QTextCursor::removeSelectedText((QTextCursor *)in_RDI);
      QTextCursor::setBlockCharFormat
                ((QTextCursor *)in_RDI,(QTextCharFormat *)CONCAT44(iVar2,in_stack_ffffffffffffffb8))
      ;
      endEditBlock(in_RDI);
      compressPieceTable(unaff_retaddr);
      bVar3 = 1;
      QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x7d619e);
      QTextCursor::~QTextCursor((QTextCursor *)0x7d61a8);
    }
    else {
      bVar3 = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return (bool)(bVar3 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QTextDocumentPrivate::ensureMaximumBlockCount()
{
    if (maximumBlockCount <= 0)
        return false;
    if (blocks.numNodes() <= maximumBlockCount)
        return false;

    beginEditBlock();

    const int blocksToRemove = blocks.numNodes() - maximumBlockCount;
    QTextCursor cursor(this, 0);
    cursor.movePosition(QTextCursor::NextBlock, QTextCursor::KeepAnchor, blocksToRemove);

    unreachableCharacterCount += cursor.selectionEnd() - cursor.selectionStart();

    // preserve the char format of the paragraph that is to become the new first one
    QTextCharFormat charFmt = cursor.blockCharFormat();
    cursor.removeSelectedText();
    cursor.setBlockCharFormat(charFmt);

    endEditBlock();

    compressPieceTable();

    return true;
}